

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  _Bool _Var1;
  roaring64_iterator_t *it_00;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint64_t unaff_retaddr;
  roaring_container_iterator_t *in_stack_00000008;
  uint8_t in_stack_00000017;
  container_t *in_stack_00000018;
  _Bool has_value;
  uint32_t container_count;
  uint16_t low16;
  leaf_t leaf;
  uint16_t *in_stack_00000038;
  uint32_t container_consumed;
  uint64_t consumed;
  undefined1 *in_stack_ffffffffffffff98;
  roaring64_bitmap_t *in_stack_ffffffffffffffa0;
  ushort local_3a;
  leaf_t local_38;
  uint local_2c;
  uint64_t local_28;
  ulong local_20;
  long local_18;
  uint64_t *in_stack_fffffffffffffff8;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if ((*(byte *)(in_RDI + 0xb0) & 1) == 0 || local_20 <= local_28) {
      return local_28;
    }
    local_38 = **(leaf_t **)(in_RDI + 0x10);
    local_3a = (ushort)*(undefined8 *)(in_RDI + 0xa8);
    it_00 = (roaring64_iterator_t *)
            get_container(in_stack_ffffffffffffffa0,(leaf_t)in_stack_ffffffffffffff98);
    get_typecode(local_38);
    in_stack_ffffffffffffff98 = (undefined1 *)&stack0xffffffffffffffd4;
    in_stack_ffffffffffffffa0 = (roaring64_bitmap_t *)&stack0xffffffffffffffc6;
    _Var1 = container_iterator_read_into_uint64
                      (in_stack_00000018,in_stack_00000017,in_stack_00000008,unaff_retaddr,
                       in_stack_fffffffffffffff8,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t *)leaf,
                       in_stack_00000038);
    local_28 = local_2c + local_28;
    local_18 = local_18 + (ulong)local_2c * 8;
    if (_Var1) break;
    _Var1 = art_iterator_next((art_iterator_t *)0x10dca9);
    *(_Bool *)(in_RDI + 0xb0) = _Var1;
    if ((*(byte *)(in_RDI + 0xb0) & 1) != 0) {
      roaring64_iterator_init_at_leaf_first(it_00);
    }
  }
  *(undefined1 *)(in_RDI + 0xb0) = 1;
  *(ulong *)(in_RDI + 0xa8) = *(ulong *)(in_RDI + 0xa0) | (ulong)local_3a;
  return local_28;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}